

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O0

uint8 * __thiscall
caffe::DummyDataParameter::InternalSerializeWithCachedSizesToArray
          (DummyDataParameter *this,bool deterministic,uint8 *target)

{
  uint uVar1;
  FillerParameter *value;
  uint8 *puVar2;
  BlobShape *value_00;
  UnknownFieldSet *unknown_fields;
  uint local_40;
  uint n_1;
  uint i_1;
  uint n;
  uint i;
  uint32 cached_has_bits;
  uint8 *target_local;
  bool deterministic_local;
  DummyDataParameter *this_local;
  
  i_1 = 0;
  uVar1 = data_filler_size(this);
  _i = target;
  for (; i_1 < uVar1; i_1 = i_1 + 1) {
    value = data_filler(this,i_1);
    _i = google::protobuf::internal::WireFormatLite::
         InternalWriteMessageNoVirtualToArray<caffe::FillerParameter>(1,value,deterministic,_i);
  }
  puVar2 = google::protobuf::internal::WireFormatLite::WriteUInt32ToArray(2,&this->num_,_i);
  puVar2 = google::protobuf::internal::WireFormatLite::WriteUInt32ToArray(3,&this->channels_,puVar2)
  ;
  puVar2 = google::protobuf::internal::WireFormatLite::WriteUInt32ToArray(4,&this->height_,puVar2);
  _i = google::protobuf::internal::WireFormatLite::WriteUInt32ToArray(5,&this->width_,puVar2);
  local_40 = 0;
  uVar1 = shape_size(this);
  for (; local_40 < uVar1; local_40 = local_40 + 1) {
    value_00 = shape(this,local_40);
    _i = google::protobuf::internal::WireFormatLite::
         InternalWriteMessageNoVirtualToArray<caffe::BlobShape>(6,value_00,deterministic,_i);
  }
  if (((uint)(this->_internal_metadata_).
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             .ptr_ & 1) == 1) {
    unknown_fields = DummyDataParameter::unknown_fields(this);
    _i = google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray(unknown_fields,_i);
  }
  return _i;
}

Assistant:

::google::protobuf::uint8* DummyDataParameter::InternalSerializeWithCachedSizesToArray(
    bool deterministic, ::google::protobuf::uint8* target) const {
  // @@protoc_insertion_point(serialize_to_array_start:caffe.DummyDataParameter)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // repeated .caffe.FillerParameter data_filler = 1;
  for (unsigned int i = 0, n = this->data_filler_size(); i < n; i++) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        1, this->data_filler(i), deterministic, target);
  }

  // repeated uint32 num = 2;
  target = ::google::protobuf::internal::WireFormatLite::
    WriteUInt32ToArray(2, this->num_, target);

  // repeated uint32 channels = 3;
  target = ::google::protobuf::internal::WireFormatLite::
    WriteUInt32ToArray(3, this->channels_, target);

  // repeated uint32 height = 4;
  target = ::google::protobuf::internal::WireFormatLite::
    WriteUInt32ToArray(4, this->height_, target);

  // repeated uint32 width = 5;
  target = ::google::protobuf::internal::WireFormatLite::
    WriteUInt32ToArray(5, this->width_, target);

  // repeated .caffe.BlobShape shape = 6;
  for (unsigned int i = 0, n = this->shape_size(); i < n; i++) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        6, this->shape(i), deterministic, target);
  }

  if (_internal_metadata_.have_unknown_fields()) {
    target = ::google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray(
        unknown_fields(), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:caffe.DummyDataParameter)
  return target;
}